

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O2

void HFSubWorker::distributionController(zsock_t *pipe,void *args)

{
  pointer pp_Var1;
  zsock_t *self;
  zloop_t *self_00;
  int i;
  int iVar2;
  pointer pp_Var3;
  zactor_t *worker;
  zsock_t **local_58;
  zloop_t *loop;
  vector<_zactor_t_*,_std::allocator<_zactor_t_*>_> workers;
  
  zsock_signal(pipe,'\0');
  self = zsock_new_checked(8,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/SpikeGadgets[P]TrodesNetwork/src/libTrodesNetwork/src/highfreqclasses.cpp"
                           ,0x184);
  local_58 = (zsock_t **)((long)args + 0xb8);
  *(zsock_t **)((long)args + 0xb8) = self;
  zsock_bind(self,"inproc://push_%p",args);
  zsock_endpoint(*(zsock_t **)((long)args + 0xb8));
  std::__cxx11::string::assign((char *)((long)args + 0xc0));
  self_00 = zloop_new();
  loop = self_00;
  zloop_reader(self_00,pipe,HighFreqSub::pipeController,args);
  (**(code **)(*args + 0x20))(args,self_00);
  workers.super__Vector_base<_zactor_t_*,_std::allocator<_zactor_t_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  workers.super__Vector_base<_zactor_t_*,_std::allocator<_zactor_t_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  workers.super__Vector_base<_zactor_t_*,_std::allocator<_zactor_t_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (iVar2 = 0; iVar2 < *(int *)((long)args + 0xb4); iVar2 = iVar2 + 1) {
    worker = zactor_new(workerthreadController,args);
    std::vector<_zactor_t_*,_std::allocator<_zactor_t_*>_>::push_back(&workers,&worker);
  }
  zloop_start(self_00);
  zsock_destroy_checked
            (local_58,
             "/workspace/llm4binary/github/license_all_cmakelists_25/SpikeGadgets[P]TrodesNetwork/src/libTrodesNetwork/src/highfreqclasses.cpp"
             ,0x195);
  zloop_destroy(&loop);
  pp_Var1 = workers.super__Vector_base<_zactor_t_*,_std::allocator<_zactor_t_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (pp_Var3 = workers.super__Vector_base<_zactor_t_*,_std::allocator<_zactor_t_*>_>._M_impl.
                 super__Vector_impl_data._M_start; pp_Var3 != pp_Var1; pp_Var3 = pp_Var3 + 1) {
    worker = *pp_Var3;
    zactor_destroy(&worker);
  }
  std::_Vector_base<_zactor_t_*,_std::allocator<_zactor_t_*>_>::~_Vector_base
            (&workers.super__Vector_base<_zactor_t_*,_std::allocator<_zactor_t_*>_>);
  return;
}

Assistant:

void HFSubWorker::distributionController(zsock_t *pipe, void *args){
    zsock_signal(pipe, 0);
    HFSubWorker *self = (HFSubWorker*)args;

    //Create push socket

    self->push = zsock_new(ZMQ_PUSH);
    zsock_bind(self->push, "inproc://push_%p", args);
    self->pullendpoint = zsock_endpoint(self->push);

    //Start loop controlling actor and sub sockets
    zloop_t *loop = zloop_new();
    zloop_reader(loop, pipe, pipeController, self);
    self->sub_reader(loop);

    //Start worker threads
    std::vector<zactor_t*> workers;
    for(int i = 0; i < self->nthreads; i++){
        zactor_t *worker = zactor_new(workerthreadController, self);
        workers.push_back(worker);
    }

    zloop_start(loop);
    zsock_destroy(&self->push);
    zloop_destroy(&loop);
    for(auto worker : workers){
        zactor_destroy(&worker);
    }
}